

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseException.cpp
# Opt level: O0

void __thiscall
rc::detail::ParseException::ParseException(ParseException *this,size_type pos,string *msg)

{
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_20;
  string *msg_local;
  size_type pos_local;
  ParseException *this_local;
  
  local_20 = msg;
  msg_local = (string *)pos;
  pos_local = (size_type)this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__ParseException_00281fd0;
  this->m_pos = (size_type)msg_local;
  std::__cxx11::string::string((string *)&this->m_msg,(string *)local_20);
  std::__cxx11::to_string(&local_90,this->m_pos);
  std::operator+(&local_70,"@",&local_90);
  std::operator+(&local_50,&local_70,": ");
  std::operator+(&this->m_what,&local_50,local_20);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

ParseException::ParseException(std::string::size_type pos,
                               const std::string &msg)
    : m_pos(pos)
    , m_msg(msg)
    , m_what("@" + std::to_string(m_pos) + ": " + msg) {}